

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult GenValidUsageNextXrGetSpatialAnchorStateML(XrSpace anchor,XrSpatialAnchorStateML *state)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrSpace_T_*>::getWithInstanceInfo(&g_space_info,anchor);
  XVar1 = (*(pVar2.second)->dispatch_table->GetSpatialAnchorStateML)(anchor,state);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetSpatialAnchorStateML(
    XrSpace anchor,
    XrSpatialAnchorStateML* state) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_space_info.getWithInstanceInfo(anchor);
        GenValidUsageXrHandleInfo *gen_space_info = info_with_instance.first;
        (void)gen_space_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->GetSpatialAnchorStateML(anchor, state);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}